

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepScanLineInputFile::readPixels
          (DeepScanLineInputFile *this,char *rawPixelData,DeepFrameBuffer *frameBuffer,int scanLine1
          ,int scanLine2)

{
  uint minY;
  ulong uVar1;
  ulong maxScanLineSize;
  char *base;
  size_t sVar2;
  size_t sVar3;
  Data *pDVar4;
  int x;
  int iVar5;
  Compression *pCVar6;
  Slice *pSVar7;
  ChannelList *this_00;
  const_iterator cVar8;
  const_iterator cVar9;
  ConstIterator CVar10;
  ConstIterator CVar11;
  int *piVar12;
  int maxY;
  int xStride;
  int yStride;
  int iVar13;
  long lVar14;
  bool bVar15;
  bool local_dc;
  Format local_c4;
  Compressor *local_a8;
  char *uncompressed_data;
  long local_80;
  long local_78;
  char *readPtr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsetInLineBuffer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bytesPerLine;
  
  minY = *(uint *)rawPixelData;
  lVar14 = *(long *)(rawPixelData + 4);
  uVar1 = *(ulong *)(rawPixelData + 0xc);
  maxScanLineSize = *(ulong *)(rawPixelData + 0x14);
  if (uVar1 < maxScanLineSize) {
    pCVar6 = Header::compression(&this->_data->header);
    local_a8 = newCompressor(*pCVar6,maxScanLineSize,&this->_data->header);
    (*local_a8->_vptr_Compressor[6])
              (local_a8,rawPixelData + lVar14 + 0x1c,uVar1 & 0xffffffff,(ulong)minY,
               &uncompressed_data);
    local_c4 = (*local_a8->_vptr_Compressor[3])(local_a8);
  }
  else {
    uncompressed_data = rawPixelData + lVar14 + 0x1c;
    local_c4 = XDR;
    local_a8 = (Compressor *)0x0;
  }
  bVar15 = this->_data->lineOrder == INCREASING_Y;
  iVar13 = scanLine1 + -1;
  if (bVar15) {
    iVar13 = scanLine2 + 1;
    scanLine2 = scanLine1;
  }
  pSVar7 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  base = pSVar7->base;
  pSVar7 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  sVar2 = pSVar7->xStride;
  pSVar7 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  sVar3 = pSVar7->yStride;
  pDVar4 = this->_data;
  iVar5 = pDVar4->maxY;
  maxY = minY + pDVar4->linesInBuffer + -1;
  if (iVar5 < maxY) {
    maxY = iVar5;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&bytesPerLine,(long)((iVar5 - pDVar4->minY) + 1),(allocator_type *)&offsetInLineBuffer)
  ;
  yStride = (int)sVar3;
  xStride = (int)sVar2;
  bytesPerDeepLineTable(&this->_data->header,minY,maxY,base,xStride,yStride,&bytesPerLine);
  offsetInLineBuffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  offsetInLineBuffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  offsetInLineBuffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = this->_data->minY;
  offsetInLineBufferTable
            (&bytesPerLine,minY - iVar5,maxY - iVar5,this->_data->linesInBuffer,&offsetInLineBuffer)
  ;
  this_00 = Header::channels(&this->_data->header);
  local_80 = (ulong)bVar15 * 2 + -1;
  local_78 = (long)iVar13;
  for (lVar14 = (long)scanLine2; lVar14 != local_78; lVar14 = lVar14 + local_80) {
    readPtr = uncompressed_data +
              offsetInLineBuffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar14 - this->_data->minY];
    cVar8._M_node = (_Base_ptr)ChannelList::begin(this_00);
    cVar9._M_node = (_Base_ptr)DeepFrameBuffer::begin(frameBuffer);
    iVar13 = -1;
    for (; CVar10 = DeepFrameBuffer::end(frameBuffer),
        (const_iterator)cVar9._M_node != CVar10._i._M_node;
        cVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar9._M_node)) {
      while ((CVar11 = ChannelList::end(this_00), (const_iterator)cVar8._M_node != CVar11._i._M_node
             && (iVar5 = strcmp((char *)(cVar8._M_node + 1),(char *)(cVar9._M_node + 1)), iVar5 < 0)
             )) {
        if (iVar13 == -1) {
          iVar5 = this->_data->minX;
          piVar12 = (int *)(base + (long)(iVar5 * xStride) + lVar14 * yStride);
          iVar13 = 0;
          for (; iVar5 <= this->_data->maxX; iVar5 = iVar5 + 1) {
            iVar13 = iVar13 + *piVar12;
            piVar12 = (int *)((long)piVar12 + (long)xStride);
          }
        }
        skipChannel(&readPtr,cVar8._M_node[9]._M_color,(long)iVar13);
        cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node);
      }
      CVar11 = ChannelList::end(this_00);
      if (((const_iterator)cVar8._M_node == CVar11._i._M_node) ||
         (iVar5 = strcmp((char *)(cVar8._M_node + 1),(char *)(cVar9._M_node + 1)), 0 < iVar5)) {
        local_dc = true;
      }
      else {
        local_dc = false;
      }
      iVar5 = Imath_3_2::modp((int)lVar14,*(int *)&cVar8._M_node[9]._M_parent);
      if (iVar5 == 0) {
        copyIntoDeepFrameBuffer
                  (&readPtr,(char *)cVar9._M_node[9]._M_parent,base,(long)xStride,(long)yStride,
                   (int)lVar14,this->_data->minX,this->_data->maxX,0,0,0,0,
                   (long)*(int *)((long)&cVar9._M_node[10]._M_left + 4),
                   (ptrdiff_t)cVar9._M_node[9]._M_left,(ptrdiff_t)cVar9._M_node[9]._M_right,local_dc
                   ,(double)cVar9._M_node[10]._M_parent,local_c4,cVar9._M_node[9]._M_color,
                   cVar8._M_node[9]._M_color);
        cVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar8._M_node);
      }
    }
  }
  if (local_a8 != (Compressor *)0x0) {
    (*local_a8->_vptr_Compressor[1])();
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&offsetInLineBuffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void
DeepScanLineInputFile::readPixels (
    const char*            rawPixelData,
    const DeepFrameBuffer& frameBuffer,
    int                    scanLine1,
    int                    scanLine2) const
{
    //
    // read header from block - already converted from Xdr to native format
    //
    int      data_scanline            = *(int*) rawPixelData;
    uint64_t sampleCountTableDataSize = *(uint64_t*) (rawPixelData + 4);
    uint64_t packedDataSize           = *(uint64_t*) (rawPixelData + 12);
    uint64_t unpackedDataSize         = *(uint64_t*) (rawPixelData + 20);

    //
    // Uncompress the data, if necessary
    //

    Compressor*        decomp = NULL;
    const char*        uncompressed_data;
    Compressor::Format format = Compressor::XDR;
    if (packedDataSize < unpackedDataSize)
    {
        decomp = newCompressor (
            _data->header.compression (), unpackedDataSize, _data->header);

        decomp->uncompress (
            rawPixelData + 28 + sampleCountTableDataSize,
            static_cast<int> (packedDataSize),
            data_scanline,
            uncompressed_data);
        format = decomp->format ();
    }
    else
    {
        //
        // If the line is uncompressed, it's in XDR format,
        // regardless of the compressor's output format.
        //

        format            = Compressor::XDR;
        uncompressed_data = rawPixelData + 28 + sampleCountTableDataSize;
    }

    int yStart, yStop, dy;

    if (_data->lineOrder == INCREASING_Y)
    {
        yStart = scanLine1;
        yStop  = scanLine2 + 1;
        dy     = 1;
    }
    else
    {
        yStart = scanLine2;
        yStop  = scanLine1 - 1;
        dy     = -1;
    }

    const char* samplecount_base = frameBuffer.getSampleCountSlice ().base;
    int         samplecount_xstride =
        static_cast<int> (frameBuffer.getSampleCountSlice ().xStride);
    int samplecount_ystride =
        static_cast<int> (frameBuffer.getSampleCountSlice ().yStride);

    //
    // For each line within the block, get the count of bytes.
    //

    int minYInLineBuffer = data_scanline;
    int maxYInLineBuffer =
        min (minYInLineBuffer + _data->linesInBuffer - 1, _data->maxY);

    vector<size_t> bytesPerLine (1 + _data->maxY - _data->minY);

    bytesPerDeepLineTable (
        _data->header,
        minYInLineBuffer,
        maxYInLineBuffer,
        samplecount_base,
        samplecount_xstride,
        samplecount_ystride,
        bytesPerLine);

    //
    // For each scanline within the block, get the offset.
    //

    vector<size_t> offsetInLineBuffer;
    offsetInLineBufferTable (
        bytesPerLine,
        minYInLineBuffer - _data->minY,
        maxYInLineBuffer - _data->minY,
        _data->linesInBuffer,
        offsetInLineBuffer);

    const ChannelList& channels = header ().channels ();

    for (int y = yStart; y != yStop; y += dy)
    {

        const char* readPtr =
            uncompressed_data + offsetInLineBuffer[y - _data->minY];

        //
        // need to know the total number of samples on a scanline to skip channels
        // compute on demand: -1 means uncomputed
        //
        int lineSampleCount = -1;

        //
        // Iterate over all image channels in frame buffer
        //

        ChannelList::ConstIterator i = channels.begin ();

        for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin ();
             j != frameBuffer.end ();
             ++j)
        {
            while (i != channels.end () && strcmp (i.name (), j.name ()) < 0)
            {
                //
                // Channel i is present in the file but not
                // in the frame buffer; skip

                if (lineSampleCount == -1)
                {
                    lineSampleCount = 0;
                    const char* ptr =
                        (samplecount_base + y * samplecount_ystride +
                         samplecount_xstride * _data->minX);
                    for (int x = _data->minX; x <= _data->maxX; x++)
                    {

                        lineSampleCount += *(const unsigned int*) ptr;
                        ptr += samplecount_xstride;
                    }
                }

                skipChannel (readPtr, i.channel ().type, lineSampleCount);

                ++i;
            }

            bool fill = false;

            if (i == channels.end () || strcmp (i.name (), j.name ()) > 0)
            {
                //
                // Channel i is present in the frame buffer, but not in the file.
                // In the frame buffer, slice j will be filled with a default value.
                //

                fill = true;
            }
            if (modp (y, i.channel ().ySampling) == 0)
            {

                copyIntoDeepFrameBuffer (
                    readPtr,
                    j.slice ().base,
                    samplecount_base,
                    samplecount_xstride,
                    samplecount_ystride,
                    y,
                    _data->minX,
                    _data->maxX,
                    0,
                    0,
                    0,
                    0,
                    j.slice ().sampleStride,
                    j.slice ().xStride,
                    j.slice ().yStride,
                    fill,
                    j.slice ().fillValue,
                    format,
                    j.slice ().type,
                    i.channel ().type);

                ++i;
            }
        } //next slice in framebuffer
    }     //next row in image

    //
    // clean up
    //

    delete decomp;
}